

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_metrics.hpp
# Opt level: O1

double __thiscall
notch::metrics::ConfusionMatrix<int,_1>::classAverage
          (ConfusionMatrix<int,_1> *this,function<double_(int)> *metric)

{
  double dVar1;
  iterator iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  _Base_ptr p_Var4;
  int iVar5;
  _Rb_tree_header *p_Var6;
  _Rb_tree_color *p_Var7;
  int class_;
  _Rb_tree_color local_64;
  double local_60;
  _Rb_tree_color *local_58;
  iterator iStack_50;
  int *local_48;
  double local_38;
  
  local_58 = (_Rb_tree_color *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  p_Var4 = (this->cm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->cm)._M_t._M_impl.super__Rb_tree_header;
  local_60 = 0.0;
  local_38 = 0.0;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    iVar5 = 0;
    do {
      local_64 = p_Var4[1]._M_color;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (local_58,iStack_50._M_current,&local_64);
      if (_Var3._M_current == iStack_50._M_current) {
        if (iStack_50._M_current == local_48) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_58,iStack_50,(int *)&local_64);
        }
        else {
          *iStack_50._M_current = local_64;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        iVar5 = iVar5 + 1;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
    local_38 = (double)iVar5;
  }
  iVar2._M_current = iStack_50._M_current;
  if (local_58 != (_Rb_tree_color *)iStack_50._M_current) {
    local_60 = 0.0;
    p_Var7 = local_58;
    do {
      local_64 = *p_Var7;
      if ((metric->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      dVar1 = (*metric->_M_invoker)((_Any_data *)metric,(int *)&local_64);
      local_60 = local_60 + dVar1;
      p_Var7 = p_Var7 + 1;
    } while (p_Var7 != (_Rb_tree_color *)iVar2._M_current);
  }
  if (local_58 != (_Rb_tree_color *)0x0) {
    operator_delete(local_58);
  }
  return local_60 / local_38;
}

Assistant:

double classAverage(std::function<double(C)> metric) {
        double sum = 0.0;
        int numClasses = 0;
        std::vector<C> uniq {};
        for (auto p : cm) { // find all uniq classes
            auto class_ = p.first.first;
            auto hasClass = std::find(uniq.begin(), uniq.end(), class_) != uniq.end();
            if (!hasClass) {
                uniq.push_back(class_);
                numClasses++;
            }
        }
        for (auto class_ : uniq) { // calculate the average
            double class_value = metric(class_);
            sum += class_value;
        }
        return sum / numClasses;
    }